

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtBip32PubkeyInput::ConvertFromStruct
          (PsbtBip32PubkeyInput *this,PsbtBip32PubkeyInputStruct *data)

{
  PsbtBip32PubkeyInputStruct *data_local;
  PsbtBip32PubkeyInput *this_local;
  
  std::__cxx11::string::operator=((string *)&this->descriptor_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->pubkey_,(string *)&data->pubkey);
  std::__cxx11::string::operator=
            ((string *)&this->master_fingerprint_,(string *)&data->master_fingerprint);
  std::__cxx11::string::operator=((string *)&this->path_,(string *)&data->path);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PsbtBip32PubkeyInput::ConvertFromStruct(
    const PsbtBip32PubkeyInputStruct& data) {
  descriptor_ = data.descriptor;
  pubkey_ = data.pubkey;
  master_fingerprint_ = data.master_fingerprint;
  path_ = data.path;
  ignore_items = data.ignore_items;
}